

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade_group.cpp
# Opt level: O1

void Am_Get_Effects_Buffers
               (Am_Object *screen,unsigned_short buffer,Am_Drawonable **primary,Am_Drawonable **mask
               )

{
  bool bVar1;
  Am_Value *pAVar2;
  long *plVar3;
  Am_Drawonable *pAVar4;
  Am_Wrapper *pAVar5;
  int iVar6;
  uint uVar7;
  Am_Value_List primary_list;
  Am_Value_List mask_list;
  Am_Value primary_value;
  Am_Value mask_value;
  Am_Value_List AStack_88;
  Am_Value_List local_78;
  Am_Drawonable **local_68;
  Am_Value local_60;
  Am_Value local_50;
  Am_Style local_40;
  Am_Style local_38;
  
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  local_50.type = 0;
  local_50.value.wrapper_value = (Am_Wrapper *)0x0;
  local_68 = mask;
  pAVar2 = Am_Object::Get(screen,0x7d3,1);
  Am_Value::operator=(&local_60,pAVar2);
  pAVar2 = Am_Object::Get(screen,0x7d4,1);
  Am_Value::operator=(&local_50,pAVar2);
  bVar1 = Am_Value_List::Test(&local_60);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&AStack_88,&local_60);
    Am_Value_List::Am_Value_List(&local_78,&local_50);
    Am_Value_List::Start(&AStack_88);
    Am_Value_List::Start(&local_78);
    if (buffer != 0) {
      uVar7 = (uint)buffer;
      do {
        bVar1 = Am_Value_List::Last(&AStack_88);
        if (bVar1) break;
        Am_Value_List::Next(&AStack_88);
        Am_Value_List::Next(&local_78);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    bVar1 = Am_Value_List::Last(&AStack_88);
    if (bVar1) {
      *primary = (Am_Drawonable *)0x0;
      pAVar4 = (Am_Drawonable *)0x0;
    }
    else {
      pAVar2 = Am_Value_List::Get(&AStack_88);
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
      *primary = pAVar4;
      pAVar2 = Am_Value_List::Get(&local_78);
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
    }
    *local_68 = pAVar4;
    Am_Value_List::~Am_Value_List(&local_78);
    Am_Value_List::~Am_Value_List(&AStack_88);
  }
  else {
    if (buffer == 0) {
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(&local_60);
      *primary = pAVar4;
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(&local_50);
    }
    else {
      pAVar4 = (Am_Drawonable *)0x0;
      *primary = (Am_Drawonable *)0x0;
    }
    *local_68 = pAVar4;
  }
  if (*primary == (Am_Drawonable *)0x0) {
    pAVar2 = Am_Object::Get(screen,0x7d2,0);
    plVar3 = (long *)Am_Value::operator_cast_to_void_(pAVar2);
    Am_Style::Am_Style(&local_38,&Am_Off_Bits);
    pAVar4 = (Am_Drawonable *)(**(code **)(*plVar3 + 0x10))(plVar3,100,100,&local_38);
    *primary = pAVar4;
    Am_Style::~Am_Style(&local_38);
    Am_Style::Am_Style(&local_40,&Am_Off_Bits);
    pAVar4 = (Am_Drawonable *)(**(code **)(*plVar3 + 0x10))(plVar3,100,100,&local_40);
    *local_68 = pAVar4;
    Am_Style::~Am_Style(&local_40);
    bVar1 = Am_Value_List::Test(&local_60);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&AStack_88,&local_60);
      Am_Value_List::Am_Value_List(&local_78,&local_50);
      Am_Value_List::Start(&AStack_88);
      Am_Value_List::Start(&local_78);
      if (buffer != 0) {
        uVar7 = (uint)buffer;
        do {
          bVar1 = Am_Value_List::Last(&AStack_88);
          if (bVar1) {
            Am_Value_List::Add(&AStack_88,(Am_Ptr)0x0,Am_TAIL,true);
            Am_Value_List::Add(&local_78,(Am_Ptr)0x0,Am_TAIL,true);
          }
          else {
            Am_Value_List::Next(&AStack_88);
            Am_Value_List::Next(&local_78);
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      Am_Value_List::Set(&AStack_88,*primary,true);
      Am_Value_List::Set(&local_78,*local_68,true);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&AStack_88);
      Am_Object::Set(screen,0x7d3,pAVar5,0);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_78);
      Am_Object::Set(screen,0x7d4,pAVar5,0);
    }
    else {
      if (buffer == 0) {
        Am_Object::Set(screen,0x7d3,*primary,0);
        Am_Object::Set(screen,0x7d4,*local_68,0);
        goto LAB_001e266f;
      }
      Am_Value_List::Am_Value_List(&AStack_88);
      Am_Value_List::Am_Value_List(&local_78);
      Am_Value_List::Add(&AStack_88,&local_60,Am_TAIL,true);
      Am_Value_List::Add(&local_78,&local_50,Am_TAIL,true);
      if (buffer != 1) {
        iVar6 = buffer - 1;
        do {
          Am_Value_List::Add(&AStack_88,(Am_Ptr)0x0,Am_TAIL,true);
          Am_Value_List::Add(&local_78,(Am_Ptr)0x0,Am_TAIL,true);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      Am_Value_List::Add(&AStack_88,*primary,Am_TAIL,true);
      Am_Value_List::Add(&local_78,*local_68,Am_TAIL,true);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&AStack_88);
      Am_Object::Set(screen,0x7d3,pAVar5,0);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_78);
      Am_Object::Set(screen,0x7d4,pAVar5,0);
    }
    Am_Value_List::~Am_Value_List(&local_78);
    Am_Value_List::~Am_Value_List(&AStack_88);
  }
LAB_001e266f:
  Am_Value::~Am_Value(&local_50);
  Am_Value::~Am_Value(&local_60);
  return;
}

Assistant:

void
Am_Get_Effects_Buffers(Am_Object screen, unsigned short buffer,
                       Am_Drawonable *&primary, Am_Drawonable *&mask)
{
  Am_Value primary_value, mask_value;
  primary_value = screen.Peek(Am_DRAW_BUFFER);
  mask_value = screen.Peek(Am_MASK_BUFFER);
  int i;
  if (Am_Value_List::Test(primary_value)) {
    Am_Value_List primary_list = primary_value;
    Am_Value_List mask_list = mask_value;
    primary_list.Start();
    mask_list.Start();
    for (i = 0; (i < buffer) && !primary_list.Last(); ++i) {
      primary_list.Next();
      mask_list.Next();
    }
    if (primary_list.Last()) {
      primary = nullptr;
      mask = nullptr;
    } else {
      primary = Am_Drawonable::Narrow(primary_list.Get());
      mask = Am_Drawonable::Narrow(mask_list.Get());
    }
  } else if (buffer == 0) {
    primary = Am_Drawonable::Narrow(primary_value);
    mask = Am_Drawonable::Narrow(mask_value);
  } else {
    primary = nullptr;
    mask = nullptr;
  }
  if (!primary) {
    Am_Drawonable *screen_drawonable =
        Am_Drawonable::Narrow(screen.Get(Am_DRAWONABLE));
    primary = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    mask = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    if (Am_Value_List::Test(primary_value)) {
      Am_Value_List primary_list = primary_value;
      Am_Value_List mask_list = mask_value;
      primary_list.Start();
      mask_list.Start();
      for (i = 0; i < buffer; ++i) {
        if (primary_list.Last()) {
          primary_list.Add((Am_Ptr)nullptr);
          mask_list.Add((Am_Ptr)nullptr);
        } else {
          primary_list.Next();
          mask_list.Next();
        }
      }
      primary_list.Set((Am_Ptr)primary);
      mask_list.Set((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    } else if (buffer == 0) {
      screen.Set(Am_DRAW_BUFFER, (Am_Ptr)primary);
      screen.Set(Am_MASK_BUFFER, (Am_Ptr)mask);
    } else {
      Am_Value_List primary_list, mask_list;
      primary_list.Add(primary_value);
      mask_list.Add(mask_value);
      for (i = 1; i < buffer; ++i) {
        primary_list.Add((Am_Ptr)nullptr);
        mask_list.Add((Am_Ptr)nullptr);
      }
      primary_list.Add((Am_Ptr)primary);
      mask_list.Add((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    }
  }
}